

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::ZIVTest
          (LoopDependenceAnalysis *this,
          pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair)

{
  SENode *pSVar1;
  SENode *pSVar2;
  char *__s;
  string *debug_msg;
  allocator<char> local_81;
  string local_80;
  string local_60;
  string local_40;
  
  pSVar1 = subscript_pair->first;
  pSVar2 = subscript_pair->second;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Performing ZIVTest",&local_81);
  PrintDebug(this,&local_40);
  std::__cxx11::string::_M_dispose();
  if (pSVar1 == pSVar2) {
    __s = "ZIVTest found EQ dependence.";
    debug_msg = &local_60;
  }
  else {
    __s = "ZIVTest found independence.";
    debug_msg = &local_80;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)debug_msg,__s,&local_81);
  PrintDebug(this,debug_msg);
  std::__cxx11::string::_M_dispose();
  return pSVar1 != pSVar2;
}

Assistant:

bool LoopDependenceAnalysis::ZIVTest(
    const std::pair<SENode*, SENode*>& subscript_pair) {
  auto source = std::get<0>(subscript_pair);
  auto destination = std::get<1>(subscript_pair);

  PrintDebug("Performing ZIVTest");
  // If source == destination, dependence with direction = and distance 0.
  if (source == destination) {
    PrintDebug("ZIVTest found EQ dependence.");
    return false;
  } else {
    PrintDebug("ZIVTest found independence.");
    // Otherwise we prove independence.
    return true;
  }
}